

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O2

deSocketResult mapSendRecvResult(int numBytes)

{
  deSocketResult dVar1;
  int *piVar2;
  
  if (0 < numBytes) {
    return DE_SOCKETRESULT_SUCCESS;
  }
  if (numBytes == 0) {
    dVar1 = DE_SOCKETRESULT_CONNECTION_CLOSED;
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 - 0x67U < 2) {
      dVar1 = DE_SOCKETRESULT_CONNECTION_TERMINATED;
    }
    else if (*piVar2 == 0xb) {
      dVar1 = DE_SOCKETRESULT_WOULD_BLOCK;
    }
    else {
      dVar1 = DE_SOCKETRESULT_ERROR;
    }
  }
  return dVar1;
}

Assistant:

static deSocketResult mapSendRecvResult (int numBytes)
{
	if (numBytes > 0)
		return DE_SOCKETRESULT_SUCCESS;
	else if (numBytes == 0)
		return DE_SOCKETRESULT_CONNECTION_CLOSED;
	else
	{
		/* Other errors. */
#if defined(DE_USE_WINSOCK)
		int	error = WSAGetLastError();
		switch (error)
		{
			case WSAEWOULDBLOCK:	return DE_SOCKETRESULT_WOULD_BLOCK;
			case WSAENETDOWN:
			case WSAENETRESET:
			case WSAECONNABORTED:
			case WSAECONNRESET:		return DE_SOCKETRESULT_CONNECTION_TERMINATED;
			default:				return DE_SOCKETRESULT_ERROR;
		}
#else
		switch (errno)
		{
			case EAGAIN:		return DE_SOCKETRESULT_WOULD_BLOCK;
			case ECONNABORTED:
			case ECONNRESET:	return DE_SOCKETRESULT_CONNECTION_TERMINATED;
			default:			return DE_SOCKETRESULT_ERROR;
		}
#endif
	}
}